

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O0

int h262_motion_vectors(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm,
                       h262_macroblock *mb,int s)

{
  uint32_t uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int local_48;
  int local_44;
  int t;
  int r;
  int dmv;
  int mfs;
  int mvc;
  int s_local;
  h262_macroblock *mb_local;
  h262_picparm *picparm_local;
  h262_seqparm *seqparm_local;
  bitstream *str_local;
  
  if (picparm->picture_structure == 3) {
    uVar1 = mb->frame_motion_type;
    if (uVar1 == 1) {
      dmv = 2;
      bVar2 = true;
      bVar3 = false;
    }
    else if (uVar1 == 2) {
      dmv = 1;
      bVar2 = false;
      bVar3 = false;
    }
    else {
      if (uVar1 != 3) {
        abort();
      }
      dmv = 1;
      bVar2 = false;
      bVar3 = true;
    }
  }
  else {
    uVar1 = mb->field_motion_type;
    if (uVar1 == 1) {
      dmv = 1;
      bVar2 = true;
      bVar3 = false;
    }
    else if (uVar1 == 2) {
      dmv = 2;
      bVar2 = true;
      bVar3 = false;
    }
    else {
      if (uVar1 != 3) {
        abort();
      }
      dmv = 1;
      bVar2 = false;
      bVar3 = true;
    }
  }
  local_44 = 0;
  do {
    if (1 < local_44) {
      return 0;
    }
    if (local_44 < dmv) {
      if ((bVar2) &&
         (iVar4 = vs_u(str,mb->motion_vertical_field_select[local_44] + s,1), iVar4 != 0)) {
        return 1;
      }
      for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
        iVar4 = vs_vlc(str,mb->motion_code[local_44][s] + local_48,motion_code_vlc);
        if (iVar4 != 0) {
          return 1;
        }
        if (mb->motion_code[local_44][s][local_48] == 0) {
          iVar4 = vs_infer(str,mb->motion_residual[local_44][s] + local_48,0);
          if (iVar4 != 0) {
            return 1;
          }
        }
        else {
          iVar4 = vs_u(str,mb->motion_residual[local_44][s] + local_48,
                       picparm->f_code[s][local_48] - 1);
          if (iVar4 != 0) {
            return 1;
          }
        }
        if ((bVar3) && (iVar4 = vs_vlc(str,mb->dmvector + local_48,dmvector_vlc), iVar4 != 0)) {
          return 1;
        }
      }
    }
    else {
      iVar4 = vs_infer(str,mb->motion_code[local_44][s],0);
      if (iVar4 != 0) {
        return 1;
      }
      iVar4 = vs_infer(str,mb->motion_code[local_44][s] + 1,0);
      if (iVar4 != 0) {
        return 1;
      }
      iVar4 = vs_infer(str,mb->motion_residual[local_44][s],0);
      if (iVar4 != 0) {
        return 1;
      }
      iVar4 = vs_infer(str,mb->motion_residual[local_44][s] + 1,0);
      if (iVar4 != 0) {
        return 1;
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

int h262_motion_vectors(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_macroblock *mb, int s) {
	int mvc, mfs, dmv;
	if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
		switch (mb->frame_motion_type) {
			case H262_FRAME_MOTION_FIELD:
				mvc = 2;
				mfs = 1;
				dmv = 0;
				break;
			case H262_FRAME_MOTION_FRAME:
				mvc = 1;
				mfs = 0;
				dmv = 0;
				break;
			case H262_FRAME_MOTION_DUAL_PRIME:
				mvc = 1;
				mfs = 0;
				dmv = 1;
				break;
			default:
				abort();
		}
	} else {
		switch (mb->field_motion_type) {
			case H262_FIELD_MOTION_FIELD:
				mvc = 1;
				mfs = 1;
				dmv = 0;
				break;
			case H262_FIELD_MOTION_16X8:
				mvc = 2;
				mfs = 1;
				dmv = 0;
				break;
			case H262_FIELD_MOTION_DUAL_PRIME:
				mvc = 1;
				mfs = 0;
				dmv = 1;
				break;
			default:
				abort();
		}
	}
	int r, t;
	for (r = 0; r < 2; r++) {
		if (r < mvc) {
			if (mfs)
				if (vs_u(str, &mb->motion_vertical_field_select[r][s], 1)) return 1;
			for (t = 0; t < 2; t++) {
				if (vs_vlc(str, &mb->motion_code[r][s][t], motion_code_vlc)) return 1;
				if (mb->motion_code[r][s][t]) {
					if (vs_u(str, &mb->motion_residual[r][s][t], picparm->f_code[s][t]-1)) return 1;
				} else {
					if (vs_infer(str, &mb->motion_residual[r][s][t], 0)) return 1;
				}
				if (dmv) {
					if (vs_vlc(str, &mb->dmvector[t], dmvector_vlc)) return 1;
				}
			}
		} else {
			if (vs_infer(str, &mb->motion_code[r][s][0], 0)) return 1;
			if (vs_infer(str, &mb->motion_code[r][s][1], 0)) return 1;
			if (vs_infer(str, &mb->motion_residual[r][s][0], 0)) return 1;
			if (vs_infer(str, &mb->motion_residual[r][s][1], 0)) return 1;
		}
	}
	return 0;
}